

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CircularBuffer.h
# Opt level: O2

size_t __thiscall
axl::sl::CircularBufferBase<char>::writeFront(CircularBufferBase<char> *this,char *p,size_t length)

{
  ulong uVar1;
  ulong length_00;
  
  uVar1 = (this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
  length_00 = uVar1 - this->m_length;
  if (length <= length_00) {
    length_00 = length;
  }
  uVar1 = ((this->m_front + uVar1) - length_00) % uVar1;
  this->m_front = uVar1;
  copyTo(this,uVar1,p,length_00);
  this->m_length = this->m_length + length_00;
  return length_00;
}

Assistant:

size_t
	writeFront(
		const C* p,
		size_t length
	) {
		size_t leftover = m_buffer.getCount() - m_length;
		if (length > leftover)
			length = leftover;

		m_front = (m_front - length + m_buffer.getCount()) % m_buffer.getCount();
		copyTo(m_front, p, length);
		m_length += length;

		ASSERT(isValid());
		return length;
	}